

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O1

prf_node_t * prf_vertex_palette_clone_f(prf_node_t *orig,prf_model_t *source,prf_model_t *target)

{
  byte *pbVar1;
  uint16_t uVar2;
  uint uVar3;
  prf_node_t *node;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *__dest;
  
  if (target->mempool_id == 0) {
    node = prf_node_create();
  }
  else {
    node = (prf_node_t *)pool_malloc(target->mempool_id,0x28);
    prf_node_clear(node);
  }
  if (node == (prf_node_t *)0x0) {
    node = (prf_node_t *)0x0;
    prf_error(9,"memory allocation problem (returned NULL)");
  }
  else {
    uVar2 = orig->length;
    node->opcode = orig->opcode;
    node->length = uVar2;
    if (target->mempool_id != 0) {
      pbVar1 = (byte *)((long)&node->flags + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    uVar6 = *(uint *)orig->data;
    if (source->vertextras != (prf_vertex_pool_s **)0x0) {
      uVar3 = prf_array_count(source->vertextras);
      if (0 < (int)uVar3) {
        uVar5 = 0;
        do {
          uVar6 = uVar6 + source->vertextras[uVar5]->position;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
    }
    if (target->mempool_id == 0) {
      puVar4 = (uint *)malloc((ulong)uVar6);
    }
    else {
      puVar4 = (uint *)pool_malloc(target->mempool_id,uVar6);
    }
    node->data = (uint8_t *)puVar4;
    if (puVar4 == (uint *)0x0) {
      prf_error(9,"memory allocation problems (returned NULL)");
      if ((node->flags & 0x100) == 0) {
        prf_node_destroy(node);
      }
      node = (prf_node_t *)0x0;
    }
    else {
      *puVar4 = uVar6;
      uVar5 = (ulong)(*(int *)orig->data - 8);
      memcpy(puVar4 + 2,(int *)((long)orig->data + 8),uVar5);
      if (source->vertextras != (prf_vertex_pool_s **)0x0) {
        uVar6 = prf_array_count(source->vertextras);
        if (0 < (int)uVar6) {
          __dest = (uint8_t *)((long)(puVar4 + 2) + uVar5);
          uVar5 = 0;
          do {
            memcpy(__dest,source->vertextras[uVar5]->data,(ulong)source->vertextras[uVar5]->position
                  );
            __dest = __dest + source->vertextras[uVar5]->position;
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
      }
      if (target->vertextras != (prf_vertex_pool_s **)0x0) {
        prf_debug(6,"vertex palette: clone inserted into model with extras");
      }
    }
  }
  return node;
}

Assistant:

static
prf_node_t *
prf_vertex_palette_clone_f(
    prf_node_t * orig,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_node_t * clone;
    uint32_t length;
    uint8_t * data;

    assert( orig != NULL && source != NULL && target != NULL );

    if ( target->mempool_id == 0 ) {
        clone = prf_node_create();
    } else {
        clone = (prf_node_t *)pool_malloc( target->mempool_id, 
					   sizeof( prf_node_t ) );
        prf_node_clear( clone );
    }
    if ( clone == NULL ) {
        prf_error( 9, "memory allocation problem (returned NULL)" );
        return NULL;
    }
    clone->opcode = orig->opcode;
    clone->length = orig->length;
    if ( target->mempool_id != 0 )
        clone->flags |= PRF_NODE_MEMPOOLED;
    assert( orig->data != NULL );

    length = ((uint32_t *) orig->data)[0];
    if ( source->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( source->vertextras );
        for ( i = 0; i < count; i++ )
            length += source->vertextras[i]->position;
    }
    if ( target->mempool_id == 0 ) 
        clone->data = (uint8_t *)malloc( length );
    else
        clone->data = (uint8_t *)pool_malloc( target->mempool_id, length );
    if ( clone->data == NULL ) {
        prf_error( 9, "memory allocation problems (returned NULL)" );
        if ( (clone->flags & PRF_NODE_MEMPOOLED) == 0 )
            prf_node_destroy( clone );
        return NULL;
    }
    data = clone->data;
    ((uint32_t *)data)[0] = length;
    data += 8;
    length = ((uint32_t *)orig->data)[0] - 8;
    memcpy( data, orig->data + 8, length );
    data += length;
    if ( source->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( source->vertextras );
        for ( i = 0; i < count; i++ ) {
            memcpy( data, source->vertextras[i]->data,
                source->vertextras[i]->position );
            data += source->vertextras[i]->position;
        }
    }
    if ( target->vertextras != NULL )
        prf_debug( 6, "vertex palette: clone inserted into model with extras" );
    return clone;
}